

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O0

void __thiscall
QPointingDevicePrivate::sendTouchCancelEvent(QPointingDevicePrivate *this,QTouchEvent *cancelEvent)

{
  bool bVar1;
  const_iterator pEVar2;
  const_iterator point;
  QObject *pQVar3;
  QPointerEvent *in_RSI;
  long in_RDI;
  EventPointData *epd_1;
  const_iterator __end1;
  const_iterator __begin1;
  mapped_container_type *__range1;
  EventPointData *epd;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_container_type *__range2;
  QVLABase<QPointingDevicePrivate::EventPointData> *in_stack_ffffffffffffffb0;
  QEventPoint *in_stack_ffffffffffffffb8;
  QTouchEvent *in_stack_ffffffffffffffc0;
  const_iterator this_00;
  const_iterator local_20;
  
  QPointerEvent::points(in_RSI);
  bVar1 = QList<QEventPoint>::isEmpty((QList<QEventPoint> *)0x407b4d);
  if (bVar1) {
    QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
    ::values((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
              *)(in_RDI + 0xf0));
    local_20 = QVLABase<QPointingDevicePrivate::EventPointData>::begin
                         ((QVLABase<QPointingDevicePrivate::EventPointData> *)0x407b84);
    pEVar2 = QVLABase<QPointingDevicePrivate::EventPointData>::end(in_stack_ffffffffffffffb0);
    for (; local_20 != pEVar2; local_20 = local_20 + 1) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x407bcb);
      if (bVar1) {
        QMutableTouchEvent::addPoint(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
    }
  }
  QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
  ::values((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
            *)(in_RDI + 0xf0));
  pEVar2 = QVLABase<QPointingDevicePrivate::EventPointData>::begin
                     ((QVLABase<QPointingDevicePrivate::EventPointData> *)0x407c22);
  point = QVLABase<QPointingDevicePrivate::EventPointData>::end(in_stack_ffffffffffffffb0);
  while (pEVar2 != point) {
    this_00 = pEVar2;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x407c69);
    if (bVar1) {
      pQVar3 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x407c7d);
      QCoreApplication::sendEvent((QObject *)pQVar3,(QEvent *)in_RSI);
    }
    QPointerEvent::setExclusiveGrabber
              ((QPointerEvent *)this_00,&point->eventPoint,(QObject *)pEVar2);
    QPointerEvent::clearPassiveGrabbers((QPointerEvent *)this_00,&point->eventPoint);
    pEVar2 = this_00 + 1;
  }
  return;
}

Assistant:

void QPointingDevicePrivate::sendTouchCancelEvent(QTouchEvent *cancelEvent)
{
    // An incoming TouchCancel event will typically not contain any points, but
    // QQuickPointerHandler::onGrabChanged needs to be called for each point
    // that has an exclusive grabber. Adding those points to the event makes it
    // an easy iteration there.
    if (cancelEvent->points().isEmpty()) {
        for (auto &epd : activePoints.values()) {
            if (epd.exclusiveGrabber)
                QMutableTouchEvent::addPoint(cancelEvent, epd.eventPoint);
        }
    }
    for (auto &epd : activePoints.values()) {
        if (epd.exclusiveGrabber)
            QCoreApplication::sendEvent(epd.exclusiveGrabber, cancelEvent);
        // The next touch event can only be a TouchBegin, so clean up.
        cancelEvent->setExclusiveGrabber(epd.eventPoint, nullptr);
        cancelEvent->clearPassiveGrabbers(epd.eventPoint);
    }
}